

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char **ppcVar1;
  char **ppcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  ostream *poVar9;
  undefined4 extraout_var;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  char **ppcVar12;
  allocator<char> local_149;
  QPDF file;
  char **local_140;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130 [3];
  char **local_118;
  undefined8 local_110;
  QPDFObjectHandle filetrailer;
  QPDFObjectHandle fileinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string fl_tmp;
  string cur_key;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  Keys;
  
  Keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &Keys._M_t._M_impl.super__Rb_tree_header._M_header;
  Keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  Keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  Keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       Keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar8 = (char *)QUtil::getWhoami(*argv);
  whoami = pcVar8;
  if (argc == 3) {
    iVar5 = strcmp(argv[1],"--dump");
    if (iVar5 != 0) goto LAB_00104a67;
  }
  else {
    if ((argc == 2) && (iVar5 = strcmp(argv[1],"--version"), iVar5 == 0)) {
      poVar9 = std::operator<<((ostream *)&std::cout,pcVar8);
      poVar9 = std::operator<<(poVar9," version ");
      poVar9 = std::operator<<(poVar9,"1.1");
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_00104f89;
    }
LAB_00104a67:
    cur_key._M_dataplus._M_p = (pointer)&cur_key.field_2;
    cur_key._M_string_length = 0;
    cur_key.field_2._M_local_buf[0] = '\0';
    local_118 = (char **)0x0;
    local_140 = (char **)0x0;
    local_110 = 0;
    iVar5 = 1;
    while (ppcVar12 = local_118, iVar5 < argc) {
      ppcVar12 = (char **)argv[iVar5];
      iVar6 = strcmp((char *)ppcVar12,"--in");
      if (iVar6 == 0) {
        iVar6 = iVar5 + 1;
        ppcVar12 = (char **)argv[(long)iVar5 + 1];
        iVar5 = iVar6;
        ppcVar1 = local_140;
        ppcVar2 = ppcVar12;
        if (argc <= iVar6) goto LAB_00104ad8;
      }
      else {
LAB_00104ad8:
        iVar7 = strcmp((char *)ppcVar12,"--out");
        iVar6 = iVar5;
        if (iVar7 == 0) {
          iVar6 = iVar5 + 1;
          ppcVar12 = (char **)argv[(long)iVar5 + 1];
          ppcVar1 = ppcVar12;
          ppcVar2 = local_118;
          if (iVar6 < argc) goto LAB_00104c2e;
        }
        iVar5 = strcmp((char *)ppcVar12,"--static-id");
        if (iVar5 == 0) {
          local_110 = CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),1);
          ppcVar1 = local_140;
          ppcVar2 = local_118;
        }
        else {
          iVar5 = strcmp((char *)ppcVar12,"--key");
          if (iVar5 == 0) {
            iVar5 = iVar6 + 1;
            ppcVar12 = (char **)argv[(long)iVar6 + 1];
            iVar6 = iVar5;
            if (iVar5 < argc) {
              std::__cxx11::string::assign((char *)&cur_key);
              if ((cur_key._M_string_length == 0) ||
                 (pcVar8 = (char *)std::__cxx11::string::at((ulong)&cur_key), *pcVar8 != '/')) {
                std::operator+(&fl_tmp,"/",&cur_key);
                std::__cxx11::string::operator=((string *)&cur_key,(string *)&fl_tmp);
                std::__cxx11::string::~string((string *)&fl_tmp);
              }
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&Keys,&cur_key);
              std::__cxx11::string::assign((char *)pmVar10);
              ppcVar1 = local_140;
              ppcVar2 = local_118;
              goto LAB_00104c2e;
            }
          }
          iVar5 = strcmp((char *)ppcVar12,"--val");
          if (((iVar5 != 0) || (argc <= iVar6 + 1)) || (cur_key._M_string_length == 0)) {
            usage();
            goto LAB_00104f7b;
          }
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&Keys,&cur_key);
          std::__cxx11::string::assign((char *)pmVar10);
          cur_key._M_string_length = 0;
          *cur_key._M_dataplus._M_p = '\0';
          iVar6 = iVar6 + 1;
          ppcVar1 = local_140;
          ppcVar2 = local_118;
        }
      }
LAB_00104c2e:
      local_118 = ppcVar2;
      local_140 = ppcVar1;
      iVar5 = iVar6 + 1;
    }
    argv = local_118;
    if (local_118 != (char **)0x0) {
      if (local_140 == (char **)0x0) {
        local_140 = local_118;
      }
      if (Keys._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fl_tmp,(char *)local_140,(allocator<char> *)&w);
        std::__cxx11::string::append((char *)&fl_tmp);
        QPDF::QPDF(&file);
        QPDF::processFile((char *)&file,(char *)ppcVar12);
        QPDF::getTrailer();
        fileinfo.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        fileinfo.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        for (p_Var11 = Keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var11 != &Keys._M_t._M_impl.super__Rb_tree_header;
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
          if (fileinfo.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&w,"/Info",(allocator<char> *)&local_c0);
            cVar3 = QPDFObjectHandle::hasKey((string *)&filetrailer);
            std::__cxx11::string::~string((string *)&w);
            if (cVar3 == '\0') {
              QPDFObjectHandle::newDictionary();
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&fileinfo,
                         (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&w);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_130);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&w,"/Info",(allocator<char> *)&local_c0);
              QPDFObjectHandle::replaceKey((string *)&filetrailer,(QPDFObjectHandle *)&w);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Info",&local_149);
              QPDFObjectHandle::getKey((string *)&local_c0);
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&fileinfo,
                         (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_c0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0._M_string_length);
            }
            std::__cxx11::string::~string((string *)&w);
          }
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var11 + 2),"");
          if (bVar4) {
            QPDFObjectHandle::removeKey((string *)&fileinfo);
          }
          else {
            QPDFObjectHandle::newString((string *)&w);
            QPDFObjectHandle::makeDirect
                      (SUB81((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&w,0));
            QPDFObjectHandle::replaceKey((string *)&fileinfo,(QPDFObjectHandle *)(p_Var11 + 1));
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_130);
          }
        }
        QPDFWriter::QPDFWriter(&w,&file,fl_tmp._M_dataplus._M_p);
        QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
        QPDFWriter::setLinearization(SUB81(&w,0));
        QPDFWriter::setStaticID(SUB81(&w,0));
        QPDFWriter::write();
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_130);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&fileinfo.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&filetrailer.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDF::~QPDF(&file);
        remove((char *)local_140);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fileinfo,"rename ",&fl_tmp);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &filetrailer,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fileinfo," ");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,(char *)local_140,(allocator<char> *)&file);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &filetrailer,&local_c0);
        iVar5 = rename(fl_tmp._M_dataplus._M_p,(char *)local_140);
        QUtil::os_wrapper((string *)&w,iVar5);
        std::__cxx11::string::~string((string *)&w);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&filetrailer);
        std::__cxx11::string::~string((string *)&fileinfo);
        std::__cxx11::string::~string((string *)&fl_tmp);
        std::__cxx11::string::~string((string *)&cur_key);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&Keys._M_t);
        return 0;
      }
    }
LAB_00104f7b:
    usage();
  }
  pdfDumpInfoDict(argv[2]);
LAB_00104f89:
  exit(0);
}

Assistant:

int
main(int argc, char* argv[])
{
    bool static_id = false;
    std::map<std::string, std::string> Keys;

    whoami = QUtil::getWhoami(argv[0]);

    if ((argc == 2) && (!strcmp(argv[1], "--version"))) {
        std::cout << whoami << " version " << version << std::endl;
        exit(0);
    }
    if ((argc == 3) && (!strcmp(argv[1], "--dump"))) {
        QTC::TC("examples", "pdf-mod-info --dump");
        pdfDumpInfoDict(argv[2]);
        exit(0);
    }

    char* fl_in = nullptr;
    char* fl_out = nullptr;
    std::string cur_key;

    for (int i = 1; i < argc; ++i) {
        if ((!strcmp(argv[i], "--in")) && (++i < argc)) {
            fl_in = argv[i];
        } else if ((!strcmp(argv[i], "--out")) && (++i < argc)) {
            fl_out = argv[i];
        } else if (!strcmp(argv[i], "--static-id")) // don't document
        {
            static_id = true; // this should be used in test suites only
        } else if ((!strcmp(argv[i], "--key")) && (++i < argc)) {
            QTC::TC("examples", "pdf-mod-info -key");
            cur_key = argv[i];
            if (!((cur_key.length() > 0) && (cur_key.at(0) == '/'))) {
                cur_key = "/" + cur_key;
            }
            Keys[cur_key] = "";
        } else if ((!strcmp(argv[i], "--val")) && (++i < argc)) {
            if (cur_key.empty()) {
                QTC::TC("examples", "pdf-mod-info usage wrong val");
                usage();
            }
            QTC::TC("examples", "pdf-mod-info -val");
            Keys[cur_key] = argv[i];
            cur_key.clear();
        } else {
            QTC::TC("examples", "pdf-mod-info usage junk");
            usage();
        }
    }
    if (!fl_in) {
        QTC::TC("examples", "pdf-mod-info no in file");
        usage();
    }
    if (!fl_out) {
        QTC::TC("examples", "pdf-mod-info in-place");
        fl_out = fl_in;
    }
    if (Keys.size() == 0) {
        QTC::TC("examples", "pdf-mod-info no keys");
        usage();
    }

    std::string fl_tmp = fl_out;
    fl_tmp += ".tmp";

    try {
        QPDF file;
        file.processFile(fl_in);

        QPDFObjectHandle filetrailer = file.getTrailer();
        QPDFObjectHandle fileinfo;

        for (auto const& it: Keys) {
            if (!fileinfo) {
                if (filetrailer.hasKey("/Info")) {
                    QTC::TC("examples", "pdf-mod-info has info");
                    fileinfo = filetrailer.getKey("/Info");
                } else {
                    QTC::TC("examples", "pdf-mod-info file no info");
                    fileinfo = QPDFObjectHandle::newDictionary();
                    filetrailer.replaceKey("/Info", fileinfo);
                }
            }
            if (it.second == "") {
                fileinfo.removeKey(it.first);
            } else {
                QPDFObjectHandle elt = fileinfo.newString(it.second);
                elt.makeDirect();
                fileinfo.replaceKey(it.first, elt);
            }
        }
        QPDFWriter w(file, fl_tmp.c_str());
        w.setStreamDataMode(qpdf_s_preserve);
        w.setLinearization(true);
        w.setStaticID(static_id); // for testing only
        w.write();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    try {
        (void)remove(fl_out);
        QUtil::os_wrapper(
            "rename " + fl_tmp + " " + std::string(fl_out), rename(fl_tmp.c_str(), fl_out));
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}